

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

int getPrec(OPCODE opcode)

{
  int iVar1;
  
  if (opcode == OP_Equal) {
    iVar1 = 5;
  }
  else if ((opcode & ~OP_Minus) == OP_Closed_parenthesis) {
    iVar1 = 4;
  }
  else if (opcode < OP_Multi) {
    iVar1 = 3;
  }
  else {
    if ((opcode & ~OP_Minus) != OP_Multi) {
      return (uint)(opcode == OP_Pow);
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int getPrec(enum OPCODE opcode)
{
    if (opcode == OP_Equal) {
        return 5;
    }

    if (opcode == OP_Open_parenthesis ||
        opcode == OP_Closed_parenthesis) {
        return 4;
    }

    if (opcode == OP_Plus ||
        opcode == OP_Minus) {
        return 3;
    }

    if (opcode == OP_Multi ||
        opcode == OP_Div) {
        return 2;
    }

    if (opcode == OP_Pow) {
        return 1;
    }

    return 0;
}